

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmtp_engine.cpp
# Opt level: O0

bool __thiscall zmq::zmtp_engine_t::handshake_v1_0(zmtp_engine_t *this)

{
  bool bVar1;
  i_encoder *piVar2;
  i_decoder *piVar3;
  stream_engine_base_t *in_RDI;
  stream_engine_base_t *unaff_retaddr;
  session_base_t *in_stack_ffffffffffffffa0;
  i_decoder *piVar4;
  i_encoder *local_50;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar5;
  i_encoder *in_stack_ffffffffffffffe8;
  stream_engine_base_t *this_00;
  error_reason_t in_stack_fffffffffffffffc;
  
  this_00 = in_RDI;
  stream_engine_base_t::session(in_RDI);
  bVar1 = session_base_t::zap_enabled(in_stack_ffffffffffffffa0);
  if (bVar1) {
    stream_engine_base_t::error(unaff_retaddr,in_stack_fffffffffffffffc);
    bVar1 = false;
  }
  else {
    piVar2 = (i_encoder *)operator_new(0x58,(nothrow_t *)&std::nothrow);
    uVar5 = 0;
    local_50 = (i_encoder *)0x0;
    if (piVar2 != (i_encoder *)0x0) {
      uVar5 = 1;
      in_stack_ffffffffffffffe8 = piVar2;
      v1_encoder_t::v1_encoder_t
                ((v1_encoder_t *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                 (size_t)in_RDI);
      local_50 = piVar2;
    }
    in_RDI->_encoder = local_50;
    if (in_RDI->_encoder == (i_encoder *)0x0) {
      fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zmtp_engine.cpp"
              ,0x13e);
      fflush(_stderr);
      zmq_abort((char *)0x311b7d);
    }
    piVar3 = (i_decoder *)operator_new(0x90,(nothrow_t *)&std::nothrow);
    piVar4 = (i_decoder *)0x0;
    if (piVar3 != (i_decoder *)0x0) {
      v1_decoder_t::v1_decoder_t
                ((v1_decoder_t *)this_00,(size_t)in_stack_ffffffffffffffe8,
                 CONCAT17(uVar5,in_stack_ffffffffffffffe0));
      piVar4 = piVar3;
    }
    in_RDI->_decoder = piVar4;
    if (in_RDI->_decoder == (i_decoder *)0x0) {
      fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zmtp_engine.cpp"
              ,0x142);
      fflush(_stderr);
      zmq_abort((char *)0x311c73);
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool zmq::zmtp_engine_t::handshake_v1_0 ()
{
    if (session ()->zap_enabled ()) {
        // reject ZMTP 1.0 connections if ZAP is enabled
        error (protocol_error);
        return false;
    }

    _encoder = new (std::nothrow) v1_encoder_t (_options.out_batch_size);
    alloc_assert (_encoder);

    _decoder = new (std::nothrow)
      v1_decoder_t (_options.in_batch_size, _options.maxmsgsize);
    alloc_assert (_decoder);

    return true;
}